

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O3

void run_schnorrsig_bench(int iters,int argc,char **argv)

{
  size_t __size;
  bool bVar1;
  char **ppcVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  undefined1 *puVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  byte *pbVar12;
  ulong uVar13;
  uint uVar14;
  undefined8 in_R9;
  ulong uVar16;
  long lVar17;
  long lVar18;
  bench_schnorrsig_data data;
  uchar sk [32];
  secp256k1_xonly_pubkey pk;
  byte abStackY_120 [28];
  undefined1 uStackY_104;
  undefined1 uStackY_103;
  undefined1 *puStackY_f8;
  code *pcStackY_f0;
  int in_stack_ffffffffffffff18;
  ulong local_e0 [2];
  void *local_d0;
  void *local_c8;
  void *local_c0;
  void *local_b8;
  uint local_ac;
  char **local_a8;
  ulong local_a0;
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined4 local_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_70 [64];
  uint uVar15;
  
  pcStackY_f0 = (code *)0x103969;
  local_a8 = argv;
  local_e0[0] = secp256k1_context_create(1);
  __size = (long)iters * 8;
  pcStackY_f0 = (code *)0x103981;
  local_d0 = malloc(__size);
  pcStackY_f0 = (code *)0x10398e;
  local_c8 = malloc(__size);
  pcStackY_f0 = (code *)0x10399b;
  local_b8 = malloc(__size);
  pcStackY_f0 = (code *)0x1039a8;
  local_c0 = malloc(__size);
  uVar13 = (ulong)(uint)iters;
  local_ac = iters;
  if (0 < iters) {
    uVar16 = 0;
    local_a0 = (ulong)(uint)iters;
    do {
      pcStackY_f0 = (code *)0x1039d4;
      puVar6 = (undefined1 *)malloc(0x20);
      pcStackY_f0 = (code *)0x1039e1;
      pvVar7 = malloc(0x40);
      pcStackY_f0 = (code *)0x1039ee;
      pvVar8 = malloc(0x60);
      pcStackY_f0 = (code *)0x1039fb;
      pvVar9 = malloc(0x20);
      local_98 = (undefined1)uVar16;
      *puVar6 = local_98;
      local_97 = (undefined1)(uVar16 >> 8);
      puVar6[1] = local_97;
      local_96 = (undefined1)(uVar16 >> 0x10);
      puVar6[2] = local_96;
      local_95 = (undefined1)(uVar16 >> 0x18);
      puVar6[3] = local_95;
      *(undefined8 *)(puVar6 + 4) = 0x6d6d6d6d6d6d6d6d;
      *(undefined8 *)(puVar6 + 0xc) = 0x6d6d6d6d6d6d6d6d;
      *(undefined8 *)(puVar6 + 0x10) = 0x6d6d6d6d6d6d6d6d;
      *(undefined8 *)(puVar6 + 0x18) = 0x6d6d6d6d6d6d6d6d;
      uStack_84 = 0x73737373;
      uStack_80 = 0x73737373;
      uStack_7c = 0x73737373;
      local_94 = 0x73737373;
      uStack_90 = 0x73737373;
      uStack_8c = 0x73737373;
      uStack_88 = 0x73737373;
      *(void **)((long)local_d0 + uVar16 * 8) = pvVar8;
      *(void **)((long)local_c8 + uVar16 * 8) = pvVar9;
      *(undefined1 **)((long)local_b8 + uVar16 * 8) = puVar6;
      *(void **)((long)local_c0 + uVar16 * 8) = pvVar7;
      pcStackY_f0 = (code *)0x103a85;
      uVar13 = local_e0[0];
      iVar4 = secp256k1_keypair_create(local_e0[0],pvVar8,&local_98);
      if (iVar4 == 0) {
        pcStackY_f0 = (code *)0x103cd2;
        run_schnorrsig_bench_cold_4();
LAB_00103cd2:
        pcStackY_f0 = (code *)0x103cd7;
        run_schnorrsig_bench_cold_3();
LAB_00103cd7:
        pcStackY_f0 = (code *)0x103cdc;
        run_schnorrsig_bench_cold_2();
LAB_00103cdc:
        pcStackY_f0 = print_number;
        run_schnorrsig_bench_cold_1();
        uVar11 = -uVar13;
        if (0 < (long)uVar13) {
          uVar11 = uVar13;
        }
        iVar4 = 0;
        if (0x5f5e0fe < uVar11 - 1) goto LAB_00103d4e;
        uVar10 = uVar11;
        uVar14 = 0xffffffff;
        goto LAB_00103d25;
      }
      in_R9 = 0;
      pcStackY_f0 = (code *)0x103aa8;
      uVar13 = local_e0[0];
      iVar4 = secp256k1_schnorrsig_sign_custom(local_e0[0],pvVar7,puVar6,0x20,pvVar8);
      if (iVar4 == 0) goto LAB_00103cd2;
      pcStackY_f0 = (code *)0x103ac2;
      uVar13 = local_e0[0];
      iVar4 = secp256k1_keypair_xonly_pub(local_e0[0],local_70,0,pvVar8);
      if (iVar4 == 0) goto LAB_00103cd7;
      pcStackY_f0 = (code *)0x103ada;
      uVar13 = local_e0[0];
      iVar4 = secp256k1_xonly_pubkey_serialize(local_e0[0],pvVar9,local_70);
      if (iVar4 != 1) goto LAB_00103cdc;
      uVar16 = uVar16 + 1;
      uVar13 = local_a0;
    } while (local_a0 != uVar16);
  }
  ppcVar2 = local_a8;
  uVar14 = local_ac;
  if (argc != 1) {
    lVar17 = (long)argc * 8;
    lVar18 = 8;
    do {
      if (lVar17 == lVar18) {
        lVar18 = 8;
        goto LAB_00103b42;
      }
      pcStackY_f0 = (code *)0x103b2b;
      iVar4 = strcmp(*(char **)((long)ppcVar2 + lVar18),"schnorrsig");
      lVar18 = lVar18 + 8;
    } while (iVar4 != 0);
  }
  goto LAB_00103b83;
  while( true ) {
    pcStackY_f0 = (code *)0x103b53;
    iVar4 = strcmp(*(char **)((long)ppcVar2 + lVar18),"sign");
    lVar18 = lVar18 + 8;
    if (iVar4 == 0) break;
LAB_00103b42:
    if (lVar17 == lVar18) {
      lVar18 = 8;
      goto LAB_00103b6a;
    }
  }
  goto LAB_00103b83;
  while( true ) {
    pcStackY_f0 = (code *)0x103bf6;
    iVar5 = strcmp(*(char **)((long)ppcVar2 + lVar18),"verify");
    iVar4 = (int)in_R9;
    lVar18 = lVar18 + 8;
    if (iVar5 == 0) break;
LAB_00103be5:
    if (lVar17 == lVar18) {
      lVar18 = 8;
      goto LAB_00103c0d;
    }
  }
  goto LAB_00103c26;
  while( true ) {
    pcStackY_f0 = (code *)0x103c1e;
    iVar5 = strcmp(*(char **)((long)ppcVar2 + lVar18),"schnorrsig_verify");
    iVar4 = (int)in_R9;
    lVar18 = lVar18 + 8;
    if (iVar5 == 0) break;
LAB_00103c0d:
    if (lVar17 == lVar18) goto LAB_00103c43;
  }
  goto LAB_00103c26;
  while (uVar10 = uVar10 * 10, uVar14 < 5) {
LAB_00103d25:
    uVar15 = uVar14;
    uVar14 = uVar15 + 1;
    if (0x5f5e0fe < uVar10 * 10 - 1) break;
  }
  if (uVar14 < 5) {
    iVar4 = uVar15 + 2;
LAB_00103d4e:
    iVar5 = 6;
    do {
      uVar10 = uVar11;
      uVar11 = uVar10 / 10;
      iVar5 = iVar5 + -1;
    } while (iVar4 != iVar5);
    uVar11 = (uVar11 + 1) - (ulong)(uVar10 % 10 < 5);
    if (iVar4 == 0) {
      uStackY_104 = 0x30;
      lVar17 = 0x1b;
      goto LAB_00103dd2;
    }
  }
  else {
    iVar4 = 6;
  }
  lVar17 = 0x1c;
  uVar10 = uVar11;
  do {
    uVar11 = uVar10 / 10;
    abStackY_120[lVar17] = (char)uVar10 + (char)uVar11 * -10 | 0x30;
    lVar17 = lVar17 + -1;
    iVar4 = iVar4 + -1;
    uVar10 = uVar11;
  } while (iVar4 != 0);
LAB_00103dd2:
  uStackY_103 = 0;
  puStackY_f8 = puVar6;
  pcStackY_f0 = (code *)uVar16;
  abStackY_120[lVar17] = 0x2e;
  uVar16 = 0;
  pbVar3 = abStackY_120;
  do {
    pbVar12 = pbVar3;
    pbVar12[lVar17 + -1] = (char)uVar11 + (char)(uVar11 / 10) * -10 | 0x30;
    uVar16 = uVar16 + 1;
    bVar1 = 9 < uVar11;
    uVar11 = uVar11 / 10;
    pbVar3 = pbVar12 + -1;
  } while (bVar1);
  if ((long)uVar13 < 0) {
    pbVar12[lVar17 + -2] = 0x2d;
    lVar17 = (lVar17 + -1) - uVar16;
    uVar16 = (ulong)((int)uVar16 + 1);
  }
  else {
    lVar17 = lVar17 - uVar16;
  }
  printf("%5.*s",uVar16 & 0xffffffff,abStackY_120 + lVar17);
  printf("%-*s",6,abStackY_120 + (int)uVar16 + lVar17);
  return;
  while( true ) {
    pcStackY_f0 = (code *)0x103b7b;
    iVar4 = strcmp(*(char **)((long)ppcVar2 + lVar18),"schnorrsig_sign");
    lVar18 = lVar18 + 8;
    if (iVar4 == 0) break;
LAB_00103b6a:
    if (lVar17 == lVar18) goto LAB_00103ba0;
  }
LAB_00103b83:
  pcStackY_f0 = (code *)0x103ba0;
  run_benchmark("schnorrsig_sign",bench_schnorrsig_sign,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)local_e0,(void *)(ulong)uVar14,(int)in_R9,
                in_stack_ffffffffffffff18);
LAB_00103ba0:
  iVar4 = (int)in_R9;
  if (argc != 1) {
    lVar17 = (long)argc * 8;
    lVar18 = 8;
    do {
      if (lVar17 == lVar18) {
        lVar18 = 8;
        goto LAB_00103be5;
      }
      pcStackY_f0 = (code *)0x103bce;
      iVar5 = strcmp(*(char **)((long)ppcVar2 + lVar18),"schnorrsig");
      iVar4 = (int)in_R9;
      lVar18 = lVar18 + 8;
    } while (iVar5 != 0);
  }
LAB_00103c26:
  pcStackY_f0 = (code *)0x103c43;
  run_benchmark("schnorrsig_verify",bench_schnorrsig_verify,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)local_e0,(void *)(ulong)uVar14,iVar4,
                in_stack_ffffffffffffff18);
LAB_00103c43:
  if (0 < (int)uVar14) {
    uVar16 = 0;
    do {
      pcStackY_f0 = (code *)0x103c57;
      free(*(void **)((long)local_d0 + uVar16 * 8));
      pcStackY_f0 = (code *)0x103c65;
      free(*(void **)((long)local_c8 + uVar16 * 8));
      pcStackY_f0 = (code *)0x103c73;
      free(*(void **)((long)local_b8 + uVar16 * 8));
      pcStackY_f0 = (code *)0x103c81;
      free(*(void **)((long)local_c0 + uVar16 * 8));
      uVar16 = uVar16 + 1;
    } while (uVar13 != uVar16);
  }
  pcStackY_f0 = (code *)0x103c93;
  free(local_d0);
  pcStackY_f0 = (code *)0x103c9d;
  free(local_c8);
  pcStackY_f0 = (code *)0x103ca7;
  free(local_b8);
  pcStackY_f0 = (code *)0x103cb1;
  free(local_c0);
  pcStackY_f0 = (code *)0x103cbb;
  secp256k1_context_destroy(local_e0[0]);
  return;
}

Assistant:

static void run_schnorrsig_bench(int iters, int argc, char** argv) {
    int i;
    bench_schnorrsig_data data;
    int d = argc == 1;

    data.ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
    data.keypairs = (const secp256k1_keypair **)malloc(iters * sizeof(secp256k1_keypair *));
    data.pk = (const unsigned char **)malloc(iters * sizeof(unsigned char *));
    data.msgs = (const unsigned char **)malloc(iters * sizeof(unsigned char *));
    data.sigs = (const unsigned char **)malloc(iters * sizeof(unsigned char *));

    CHECK(MSGLEN >= 4);
    for (i = 0; i < iters; i++) {
        unsigned char sk[32];
        unsigned char *msg = (unsigned char *)malloc(MSGLEN);
        unsigned char *sig = (unsigned char *)malloc(64);
        secp256k1_keypair *keypair = (secp256k1_keypair *)malloc(sizeof(*keypair));
        unsigned char *pk_char = (unsigned char *)malloc(32);
        secp256k1_xonly_pubkey pk;
        msg[0] = sk[0] = i;
        msg[1] = sk[1] = i >> 8;
        msg[2] = sk[2] = i >> 16;
        msg[3] = sk[3] = i >> 24;
        memset(&msg[4], 'm', MSGLEN - 4);
        memset(&sk[4], 's', 28);

        data.keypairs[i] = keypair;
        data.pk[i] = pk_char;
        data.msgs[i] = msg;
        data.sigs[i] = sig;

        CHECK(secp256k1_keypair_create(data.ctx, keypair, sk));
        CHECK(secp256k1_schnorrsig_sign_custom(data.ctx, sig, msg, MSGLEN, keypair, NULL));
        CHECK(secp256k1_keypair_xonly_pub(data.ctx, &pk, NULL, keypair));
        CHECK(secp256k1_xonly_pubkey_serialize(data.ctx, pk_char, &pk) == 1);
    }

    if (d || have_flag(argc, argv, "schnorrsig") || have_flag(argc, argv, "sign") || have_flag(argc, argv, "schnorrsig_sign")) run_benchmark("schnorrsig_sign", bench_schnorrsig_sign, NULL, NULL, (void *) &data, 10, iters);
    if (d || have_flag(argc, argv, "schnorrsig") || have_flag(argc, argv, "verify") || have_flag(argc, argv, "schnorrsig_verify")) run_benchmark("schnorrsig_verify", bench_schnorrsig_verify, NULL, NULL, (void *) &data, 10, iters);

    for (i = 0; i < iters; i++) {
        free((void *)data.keypairs[i]);
        free((void *)data.pk[i]);
        free((void *)data.msgs[i]);
        free((void *)data.sigs[i]);
    }

    /* Casting to (void *) avoids a stupid warning in MSVC. */
    free((void *)data.keypairs);
    free((void *)data.pk);
    free((void *)data.msgs);
    free((void *)data.sigs);

    secp256k1_context_destroy(data.ctx);
}